

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13acd4::EqualizerState::process
          (EqualizerState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  span<const_float,_18446744073709551615UL> src;
  span<const_float,_18446744073709551615UL> src_00;
  pointer ptr;
  const_pointer ptr_00;
  index_type in_RSI;
  DualBiquadR<float> *in_RDI;
  pointer in_R8;
  pointer in_R9;
  span<const_float,_18446744073709551615UL> inbuf;
  array<float,_1024UL> *input;
  iterator __end1;
  iterator __begin1;
  span<const_std::array<float,_1024UL>,_18446744073709551615UL> *__range1;
  anon_struct_240_3_8d696fa7 *chan;
  span<float,_18446744073709551615UL> buffer;
  span<float,_18446744073709551615UL> *in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff28;
  pointer in_stack_ffffffffffffff30;
  undefined8 local_c8;
  undefined8 local_c0;
  span<const_float,_18446744073709551615UL> local_78;
  iterator local_68;
  iterator local_60;
  iterator local_58;
  span<const_std::array<float,_1024UL>,_18446744073709551615UL> *local_50;
  DualBiquadR<float> *local_48;
  span<float,_18446744073709551615UL> local_40;
  index_type local_30;
  pointer local_20;
  pointer local_18;
  span<const_std::array<float,_1024UL>,_18446744073709551615UL> local_10;
  
  local_30 = in_RSI;
  local_20 = in_R8;
  local_18 = in_R9;
  ptr = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x1d8d80);
  al::span<float,_18446744073709551615UL>::span(&local_40,ptr,local_30);
  local_48 = in_RDI + 2;
  local_50 = &local_10;
  local_58 = al::span<const_std::array<float,_1024UL>,_18446744073709551615UL>::begin(local_50);
  local_60 = al::span<const_std::array<float,_1024UL>,_18446744073709551615UL>::end(local_50);
  for (; local_58 != local_60; local_58 = local_58 + 1) {
    local_68 = local_58;
    ptr_00 = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x1d8e16);
    al::span<const_float,_18446744073709551615UL>::span(&local_78,ptr_00,local_30);
    al::span<float,_18446744073709551615UL>::begin(&local_40);
    src.mDataEnd = in_stack_ffffffffffffff30;
    src.mData = in_stack_ffffffffffffff28;
    DualBiquadR<float>::process(in_RDI,src,(float *)in_stack_ffffffffffffff18);
    al::span<const_float,_18446744073709551615UL>::span<float,_18446744073709551615UL,_true,_true>
              ((span<const_float,_18446744073709551615UL> *)in_RDI,in_stack_ffffffffffffff18);
    al::span<float,_18446744073709551615UL>::begin(&local_40);
    src_00.mDataEnd = in_stack_ffffffffffffff30;
    src_00.mData = in_stack_ffffffffffffff28;
    DualBiquadR<float>::process(in_RDI,src_00,(float *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff18 = (span<float,_18446744073709551615UL> *)MixSamples;
    al::span<const_float,_18446744073709551615UL>::span<float,_18446744073709551615UL,_true,_true>
              ((span<const_float,_18446744073709551615UL> *)in_RDI,
               (span<float,_18446744073709551615UL> *)MixSamples);
    in_stack_ffffffffffffff28 = local_20;
    in_stack_ffffffffffffff30 = local_18;
    (*(code *)in_stack_ffffffffffffff18)
              (local_c8,local_c0,local_20,local_18,local_48 + 7,local_48 + 0xb,local_30,0);
    local_48 = local_48 + 0xf;
  }
  return;
}

Assistant:

void EqualizerState::process(const size_t samplesToDo, const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    const al::span<float> buffer{mSampleBuffer.data(), samplesToDo};
    auto chan = std::addressof(mChans[0]);
    for(const auto &input : samplesIn)
    {
        const al::span<const float> inbuf{input.data(), samplesToDo};
        DualBiquad{chan->filter[0], chan->filter[1]}.process(inbuf, buffer.begin());
        DualBiquad{chan->filter[2], chan->filter[3]}.process(buffer, buffer.begin());

        MixSamples(buffer, samplesOut, chan->CurrentGains, chan->TargetGains, samplesToDo, 0u);
        ++chan;
    }
}